

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::Clipper::FixupFirstLefts3(Clipper *this,OutRec *OldOutRec,OutRec *NewOutRec)

{
  value_type pOVar1;
  OutRec *pOVar2;
  reference ppOVar3;
  OutRec *firstLeft;
  OutRec *outRec;
  size_type i;
  OutRec *NewOutRec_local;
  OutRec *OldOutRec_local;
  Clipper *this_local;
  
  outRec = (OutRec *)0x0;
  while( true ) {
    pOVar2 = (OutRec *)
             std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                       ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                        ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]));
    if (pOVar2 <= outRec) break;
    ppOVar3 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                         ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]),(size_type)outRec
                        );
    pOVar1 = *ppOVar3;
    pOVar2 = ParseFirstLeft(pOVar1->FirstLeft);
    if ((pOVar1->Pts != (OutPt *)0x0) && (pOVar2 == OldOutRec)) {
      pOVar1->FirstLeft = NewOutRec;
    }
    outRec = (OutRec *)((long)&outRec->Idx + 1);
  }
  return;
}

Assistant:

void Clipper::FixupFirstLefts3(OutRec* OldOutRec, OutRec* NewOutRec)
{
  //reassigns FirstLeft WITHOUT testing if NewOutRec contains the polygon
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec* outRec = m_PolyOuts[i];
    OutRec* firstLeft = ParseFirstLeft(outRec->FirstLeft);
    if (outRec->Pts && firstLeft == OldOutRec)
      outRec->FirstLeft = NewOutRec;
  }
}